

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex9.cpp
# Opt level: O1

void func_arr(void)

{
  int i;
  void *pvVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  
  pvVar1 = operator_new__(400);
  lVar2 = 0;
  do {
    *(int *)((long)pvVar1 + lVar2 * 4) = (int)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 100);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nMemory addresses in array:",0x1b);
  uVar4 = 0xfffffffffffffff6;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n&arr[",6);
    uVar4 = uVar4 + 10;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] = ",4);
    std::ostream::_M_insert<void_const*>(poVar3);
  } while (uVar4 < 0x5a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  operator_delete__(pvVar1);
  return;
}

Assistant:

void func_arr()
{
	constexpr unsigned int size = 100;
	int* arr = new int[size];
	for (int i = 0; i < size; i++)
	{
		arr[i] = i;
	}
	std::cout << "\nMemory addresses in array:";
	for (int i = 0; i < size; i += 10)
	{
		std::cout << "\n&arr[" << i << "] = " << &arr[i];
	}
	std::cout << std::endl;
	delete[] arr;
}